

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O3

string * __thiscall
flatbuffers::java::GenMethod_abi_cxx11_(string *__return_storage_ptr__,java *this,FieldDef *field)

{
  string *extraout_RAX;
  string *psVar1;
  string *extraout_RAX_00;
  char *pcVar2;
  allocator local_31;
  string local_30;
  
  if (0xb < (int)this - 1U) {
    if ((int)this == 0xf) {
      pcVar2 = "Offset";
      if ((char)field->padding != '\0') {
        pcVar2 = "Struct";
      }
    }
    else {
      pcVar2 = "Offset";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + 6);
    return extraout_RAX_00;
  }
  std::__cxx11::string::string
            ((string *)&local_30,
             *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                       ((ulong)this & 0xffffffff) * 8),&local_31);
  MakeCamel(__return_storage_ptr__,&local_30,true);
  psVar1 = (string *)&local_30.field_2;
  if ((string *)local_30._M_dataplus._M_p != psVar1) {
    operator_delete(local_30._M_dataplus._M_p);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

static std::string GenMethod(const FieldDef &field) {
  return IsScalar(field.value.type.base_type)
    ? MakeCamel(GenTypeBasic(field.value.type))
    : (IsStruct(field.value.type) ? "Struct" : "Offset");
}